

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_get.c
# Opt level: O2

longlong get_big_int(FMFieldPtr field,void *data)

{
  FMdata_type FVar1;
  short sVar2;
  int iVar3;
  unsigned_long_long uVar4;
  size_t sVar5;
  void *in_RDX;
  longlong lVar6;
  bool bVar7;
  longdouble in_ST0;
  long tmp;
  
  FVar1 = field->data_type;
  if (FVar1 == float_type) {
    get_big_float((longdouble *)field,(FMFieldPtr)data,in_RDX);
    return (long)in_ST0;
  }
  if (FVar1 == unsigned_type) {
    uVar4 = get_big_unsigned(field,data);
    return uVar4;
  }
  if (FVar1 != integer_type) {
    fwrite("Get IOlong failed on invalid data type!\n",0x28,1,_stderr);
    exit(1);
  }
  switch(field->size) {
  case 1:
    lVar6 = (longlong)*(char *)((long)data + field->offset);
    break;
  case 2:
    sVar2 = *(short *)((long)data + field->offset);
    tmp = CONCAT62(tmp._2_6_,sVar2);
    if (field->byte_swap != '\0') {
      byte_swap((char *)&tmp,2);
      sVar2 = (short)tmp;
    }
    lVar6 = (longlong)sVar2;
    break;
  case 4:
    iVar3 = *(int *)((long)data + field->offset);
    tmp = CONCAT44(tmp._4_4_,iVar3);
    if (field->byte_swap != '\0') {
      byte_swap((char *)&tmp,4);
      iVar3 = (int)tmp;
    }
    lVar6 = (longlong)iVar3;
    break;
  case 8:
    lVar6 = *(longlong *)((long)data + field->offset);
    bVar7 = field->byte_swap == '\0';
joined_r0x0011f0e5:
    if (!bVar7) {
      tmp = lVar6;
      byte_swap((char *)&tmp,8);
      lVar6 = tmp;
    }
    break;
  default:
    if (field->size == 0x10) {
      bVar7 = field->byte_swap == '\0';
      sVar5 = field->offset + 8;
      if (bVar7) {
        sVar5 = field->offset;
      }
      lVar6 = *(longlong *)((long)data + sVar5);
      goto joined_r0x0011f0e5;
    }
  case 3:
  case 5:
  case 6:
  case 7:
    lVar6 = -1;
    if (get_long_warn == 0) {
      fprintf(_stderr,"Get Long failed!  Size problems.  File int size is %d.\n");
      get_long_warn = get_long_warn + 1;
    }
  }
  return lVar6;
}

Assistant:

static MAX_INTEGER_TYPE
get_big_int(FMFieldPtr field, void *data)
{
    if (field->data_type == integer_type) {
	if (field->size == sizeof(char)) {
	    char tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(char));
	    return (long) tmp;
	} else if (field->size == sizeof(short)) {
	    short tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(short));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(short));
	    return (long) tmp;
	} else if (field->size == sizeof(int)) {
	    int tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(int));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int) sizeof(int));
	    return (long) tmp;
	} else if (field->size == sizeof(size_t)) {
	    size_t tmp;
	    memcpy(&tmp, (char *) data + field->offset, sizeof(size_t));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(size_t));
	    return tmp;
	} else if (field->size == 2 * sizeof(long)) {
	    long tmp;
	    size_t low_bytes_offset = field->offset;
	    if (WORDS_BIGENDIAN) {
		if (!field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    } else {
		if (field->byte_swap) {
		    low_bytes_offset += sizeof(long);
		}
	    }
	    memcpy(&tmp, (char *) data + low_bytes_offset, sizeof(long));
	    if (field->byte_swap)
		byte_swap((char *) &tmp, (int)sizeof(long));
	    return tmp;
	} else {
	    if (!get_long_warn) {
		fprintf(stderr, "Get Long failed!  Size problems.  File int size is %d.\n", field->size);
		get_long_warn++;
	    }
	    return -1;
	}
    } else if (field->data_type == unsigned_type) {
	MAX_UNSIGNED_TYPE tmp = get_big_unsigned(field, data);
	return (MAX_UNSIGNED_TYPE) tmp;
    } else if (field->data_type == float_type) {
	MAX_FLOAT_TYPE tmp = get_big_float(field, data);
#ifndef METICULOUS_FLOATS_AND_LONGS
	return (MAX_INTEGER_TYPE) (long) (double) tmp;
#else
	return (MAX_INTEGER_TYPE) tmp;
#endif
    } else {
	fprintf(stderr, "Get IOlong failed on invalid data type!\n");
	exit(1);
    }
    /* NOTREACHED */
    return 0;
}